

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

int chknode(chkctx *ctx,int level,node234_conflict *node,void *lowbound,void *highbound)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  uint local_74;
  int subcount;
  void *higher_1;
  void *lower_1;
  void *higher;
  void *lower;
  int local_40;
  int shouldkids;
  int count;
  int i;
  int nelems;
  int nkids;
  void *highbound_local;
  void *lowbound_local;
  node234_conflict *node_local;
  int level_local;
  chkctx *ctx_local;
  
  i = 0;
  while( true ) {
    bVar3 = false;
    if (i < 4) {
      bVar3 = node->kids[i] != (node234 *)0x0;
    }
    if (!bVar3) break;
    i = i + 1;
  }
  for (shouldkids = i; shouldkids < 4; shouldkids = shouldkids + 1) {
    if (node->kids[shouldkids] == (node234 *)0x0) {
      if (node->counts[shouldkids] != 0) {
        error("node %p: kids[%d] NULL but count[%d]=%d nonzero",node,(ulong)(uint)shouldkids,
              (ulong)(uint)shouldkids,(ulong)(uint)node->counts[shouldkids]);
      }
    }
    else {
      error("node %p: nkids=%d but kids[%d] non-NULL",node,(ulong)(uint)i,(ulong)(uint)shouldkids);
    }
  }
  count = 0;
  while( true ) {
    bVar3 = false;
    if (count < 3) {
      bVar3 = node->elems[count] != (void *)0x0;
    }
    if (!bVar3) break;
    count = count + 1;
  }
  for (shouldkids = count; shouldkids < 3; shouldkids = shouldkids + 1) {
    if (node->elems[shouldkids] != (void *)0x0) {
      error("node %p: nelems=%d but elems[%d] non-NULL",node,(ulong)(uint)count,
            (ulong)(uint)shouldkids);
    }
  }
  if (i == 0) {
    if (ctx->treedepth < 0) {
      ctx->treedepth = level;
    }
    else if (ctx->treedepth != level) {
      error("node %p: leaf at depth %d, previously seen depth %d",node,(ulong)(uint)level,
            (ulong)(uint)ctx->treedepth);
    }
  }
  else {
    if (count == 0) {
      local_74 = 0;
    }
    else {
      local_74 = count + 1;
    }
    if (i != local_74) {
      error("node %p: %d elems should mean %d kids but has %d",node,(ulong)(uint)count,
            (ulong)local_74,(ulong)(uint)i);
    }
  }
  if (count == 0) {
    error("node %p: no elems",node);
  }
  ctx->elemcount = count + ctx->elemcount;
  if (cmp != (cmpfn234)0x0) {
    for (shouldkids = -1; shouldkids < count; shouldkids = shouldkids + 1) {
      local_80 = lowbound;
      if (shouldkids != -1) {
        local_80 = node->elems[shouldkids];
      }
      local_88 = highbound;
      if (shouldkids + 1 != count) {
        local_88 = node->elems[shouldkids + 1];
      }
      if (((local_80 != (void *)0x0) && (local_88 != (void *)0x0)) &&
         (iVar1 = (*cmp)(local_80,local_88), -1 < iVar1)) {
        error("node %p: kid comparison [%d=%s,%d=%s] failed",node,(ulong)(uint)shouldkids,local_80,
              (ulong)(shouldkids + 1),local_88);
      }
    }
  }
  for (shouldkids = 0; shouldkids < i; shouldkids = shouldkids + 1) {
    if (node->kids[shouldkids]->parent != node) {
      error("node %p kid %d: parent ptr is %p not %p",node,(ulong)(uint)shouldkids,
            node->kids[shouldkids]->parent,node);
    }
  }
  local_40 = count;
  for (shouldkids = 0; shouldkids < i; shouldkids = shouldkids + 1) {
    local_90 = lowbound;
    if (shouldkids != 0) {
      local_90 = node->elems[shouldkids + -1];
    }
    local_98 = highbound;
    if (shouldkids < count) {
      local_98 = node->elems[shouldkids];
    }
    uVar2 = chknode(ctx,level + 1,node->kids[shouldkids],local_90,local_98);
    if (node->counts[shouldkids] != uVar2) {
      error("node %p kid %d: count says %d, subtree really has %d",node,(ulong)(uint)shouldkids,
            (ulong)(uint)node->counts[shouldkids],(ulong)uVar2);
    }
    local_40 = uVar2 + local_40;
  }
  return local_40;
}

Assistant:

int chknode(chkctx * ctx, int level, node234 * node,
            void *lowbound, void *highbound)
{
    int nkids, nelems;
    int i;
    int count;

    /* Count the non-NULL kids. */
    for (nkids = 0; nkids < 4 && node->kids[nkids]; nkids++);
    /* Ensure no kids beyond the first NULL are non-NULL. */
    for (i = nkids; i < 4; i++)
        if (node->kids[i]) {
            error("node %p: nkids=%d but kids[%d] non-NULL",
                  node, nkids, i);
        } else if (node->counts[i]) {
            error("node %p: kids[%d] NULL but count[%d]=%d nonzero",
                  node, i, i, node->counts[i]);
        }

    /* Count the non-NULL elements. */
    for (nelems = 0; nelems < 3 && node->elems[nelems]; nelems++);
    /* Ensure no elements beyond the first NULL are non-NULL. */
    for (i = nelems; i < 3; i++)
        if (node->elems[i]) {
            error("node %p: nelems=%d but elems[%d] non-NULL",
                  node, nelems, i);
        }

    if (nkids == 0) {
        /*
         * If nkids==0, this is a leaf node; verify that the tree
         * depth is the same everywhere.
         */
        if (ctx->treedepth < 0)
            ctx->treedepth = level;    /* we didn't know the depth yet */
        else if (ctx->treedepth != level)
            error("node %p: leaf at depth %d, previously seen depth %d",
                  node, level, ctx->treedepth);
    } else {
        /*
         * If nkids != 0, then it should be nelems+1, unless nelems
         * is 0 in which case nkids should also be 0 (and so we
         * shouldn't be in this condition at all).
         */
        int shouldkids = (nelems ? nelems + 1 : 0);
        if (nkids != shouldkids) {
            error("node %p: %d elems should mean %d kids but has %d",
                  node, nelems, shouldkids, nkids);
        }
    }

    /*
     * nelems should be at least 1.
     */
    if (nelems == 0) {
        error("node %p: no elems", node);
    }

    /*
     * Add nelems to the running element count of the whole tree.
     */
    ctx->elemcount += nelems;

    /*
     * Check ordering property: all elements should be strictly >
     * lowbound, strictly < highbound, and strictly < each other in
     * sequence. (lowbound and highbound are NULL at edges of tree
     * - both NULL at root node - and NULL is considered to be <
     * everything and > everything. IYSWIM.)
     */
    if (cmp) {
        for (i = -1; i < nelems; i++) {
            void *lower = (i == -1 ? lowbound : node->elems[i]);
            void *higher =
                (i + 1 == nelems ? highbound : node->elems[i + 1]);
            if (lower && higher && cmp(lower, higher) >= 0) {
                error("node %p: kid comparison [%d=%s,%d=%s] failed",
                      node, i, (char *)lower, i + 1, (char *)higher);
            }
        }
    }

    /*
     * Check parent pointers: all non-NULL kids should have a
     * parent pointer coming back to this node.
     */
    for (i = 0; i < nkids; i++)
        if (node->kids[i]->parent != node) {
            error("node %p kid %d: parent ptr is %p not %p",
                  node, i, node->kids[i]->parent, node);
        }


    /*
     * Now (finally!) recurse into subtrees.
     */
    count = nelems;

    for (i = 0; i < nkids; i++) {
        void *lower = (i == 0 ? lowbound : node->elems[i - 1]);
        void *higher = (i >= nelems ? highbound : node->elems[i]);
        int subcount =
            chknode(ctx, level + 1, node->kids[i], lower, higher);
        if (node->counts[i] != subcount) {
            error("node %p kid %d: count says %d, subtree really has %d",
                  node, i, node->counts[i], subcount);
        }
        count += subcount;
    }

    return count;
}